

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::VirtualInterfaceTypeSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,VirtualInterfaceTypeSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (VirtualInterfaceTypeSyntax *)0x0:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[1].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (VirtualInterfaceTypeSyntax *)0x1:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[2].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (VirtualInterfaceTypeSyntax *)0x2:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[3].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (VirtualInterfaceTypeSyntax *)0x3:
    return *(PtrTokenOrSyntax **)
            ((long)&__return_storage_ptr__[4].
                    super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
            + 8);
  case (VirtualInterfaceTypeSyntax *)0x4:
    return *(PtrTokenOrSyntax **)
            &__return_storage_ptr__[5].
             super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax VirtualInterfaceTypeSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &virtualKeyword;
        case 1: return &interfaceKeyword;
        case 2: return &name;
        case 3: return parameters;
        case 4: return modport;
        default: return nullptr;
    }
}